

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::put(buffer *this,byte *ba,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  byte *len_00;
  ulong in_RDX;
  buffer *in_RDI;
  size_t i;
  byte *d;
  ulong local_38;
  byte *in_stack_ffffffffffffffd8;
  buffer *in_stack_ffffffffffffffe0;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < 4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer to store int32 length");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  len_00 = data(in_RDI);
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    len_00[local_38] = (byte)(in_RDX >> ((byte)(local_38 << 3) & 0x3f));
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 4;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 4;
  }
  put_raw(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(size_t)len_00);
  return;
}

Assistant:

void buffer::put(const byte* ba, size_t len)
{
    // put length as int32 first
    if (size() - pos() < sz_int) {
        throw std::overflow_error("insufficient buffer to store int32 length");
    }

    byte* d = data();
    for (size_t i = 0; i < sz_int; ++i) {
        *(d + i) = (byte)(len >> (i * 8));
    }

    __mv_fw_block(this, sz_int);

    // put bytes
    put_raw(ba, len);
}